

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _all.c
# Opt level: O1

int greatest_prng_init_second_pass(int id,unsigned_long seed)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  
  uVar1 = greatest_info.prng[id].count;
  if (uVar1 != 0) {
    greatest_info.prng[id].mod = 1;
    greatest_info.prng[id].count_ceil = uVar1;
    if (uVar1 != 1) {
      uVar4 = 1;
      do {
        uVar4 = uVar4 * 2;
      } while (uVar4 < uVar1);
      greatest_info.prng[id].mod = uVar4;
    }
    uVar3 = (uint)seed & 0x1fffffff;
    greatest_info.prng[id].state = (ulong)uVar3;
    greatest_info.prng[id].a = (ulong)uVar3 * 4 + 1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = seed * 0x4043;
    greatest_info.prng[id].c =
         *(unsigned_long *)
          ((long)greatest_prng_init_second_pass::primes +
          (ulong)((int)(seed * 0x4043) +
                  (SUB164(auVar2 * ZEXT816(0x4ec4ec4ec4ec4ec5),8) >> 5) * -0x68 & 0x78));
    greatest_info.prng[id].initialized = '\x01';
    return 1;
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN();

    RUN_SUITE(CGTFS_Database);
    RUN_SUITE(CGTFS_DatabaseStoring);
    RUN_SUITE(CGTFS_DatabaseFetching);  // Run CGTFS_DatabaseStoring first!
    RUN_SUITE(CGTFS_DatabaseUtils);

    RUN_SUITE(CGTFS_DatabaseAgency);
    RUN_SUITE(CGTFS_DatabaseCalendarDates);
    RUN_SUITE(CGTFS_DatabaseCalendarRecords);
    RUN_SUITE(CGTFS_DatabaseFareAttributes);
    RUN_SUITE(CGTFS_DatabaseFareFule);
    RUN_SUITE(CGTFS_DatabaseFeedInfo);
    RUN_SUITE(CGTFS_DatabaseFrequency);
    RUN_SUITE(CGTFS_DatabaseLevel);
    RUN_SUITE(CGTFS_DatabasePathway);
    RUN_SUITE(CGTFS_DatabaseRoute);
    RUN_SUITE(CGTFS_DatabaseShape);
    RUN_SUITE(CGTFS_DatabaseStopTime);
    RUN_SUITE(CGTFS_DatabaseStop);
    RUN_SUITE(CGTFS_DatabaseTransfers);
    RUN_SUITE(CGTFS_DatabaseTrip);

    RUN_SUITE(CGTFS_EnumParsing);
    RUN_SUITE(CGTFS_Feed);
    RUN_SUITE(CGTFS_Filenames);
    RUN_SUITE(CGTFS_Haversine);

    RUN_SUITE(CGTFS_FileUtils);
    RUN_SUITE(CGTFS_StrUtils);

    RUN_SUITE(CGTFS_RecordAgency);
    RUN_SUITE(CGTFS_RecordCalendarDate);
    RUN_SUITE(CGTFS_RecordCalendarRecord);
    RUN_SUITE(CGTFS_RecordFareAttributes);
    RUN_SUITE(CGTFS_RecordFareRule);
    RUN_SUITE(CGTFS_RecordFeedInfo);
    RUN_SUITE(CGTFS_RecordFrequency);
    RUN_SUITE(CGTFS_RecordLevel);
    RUN_SUITE(CGTFS_RecordPathway);
    RUN_SUITE(CGTFS_RecordRoute);
    RUN_SUITE(CGTFS_RecordShape);
    RUN_SUITE(CGTFS_RecordStopTime);
    RUN_SUITE(CGTFS_RecordStop);
    RUN_SUITE(CGTFS_RecordTransfer);
    RUN_SUITE(CGTFS_RecordTrip);

    RUN_SUITE(CGTFS_FileReading);

    GREATEST_MAIN_END();
}